

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_QuakeEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  PClass *pPVar7;
  int iVar8;
  undefined4 extraout_var;
  AActor *activator;
  char *pcVar10;
  int falloff;
  int highpoint;
  bool bVar11;
  void *waveSpeedX;
  void *waveSpeedY;
  void *waveSpeedZ;
  double rollIntensity;
  FSoundID local_34;
  PClass *pPVar9;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003dc7a5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dc795:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dc7a5:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143d,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003dc4de;
    pPVar9 = (activator->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar8 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar8);
      (activator->super_DThinker).super_DObject.Class = pPVar9;
    }
    bVar11 = pPVar9 != (PClass *)0x0;
    if (pPVar9 != pPVar7 && bVar11) {
      do {
        pPVar9 = pPVar9->ParentClass;
        bVar11 = pPVar9 != (PClass *)0x0;
        if (pPVar9 == pPVar7) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dc7a5;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003dc795;
LAB_003dc4de:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc7cd:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143e,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc7cd;
  }
  if (numparam < 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc7f5:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143f,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc7f5;
  }
  if (numparam == 3) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc81d:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1440,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc81d;
  }
  if ((uint)numparam < 5) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc845:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1441,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc845;
  }
  if (numparam == 5) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc86d:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1442,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc86d;
  }
  if ((uint)numparam < 7) {
    pcVar10 = "(paramnum) < numparam";
LAB_003dc895:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1443,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar10 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc895;
  }
  pVVar1 = param + 1;
  pVVar2 = param + 2;
  pVVar3 = param + 3;
  pVVar4 = param + 4;
  pVVar5 = param + 5;
  pVVar6 = param + 6;
  if (numparam == 7) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc99f:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1444,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
LAB_003dc5c3:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc9be:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1445,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar8 = param[8].field_0.i;
LAB_003dc5d8:
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc96e:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1446,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedX = param[9].field_0.field_1.a;
LAB_003dc5ef:
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc94f:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1447,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedY = param[10].field_0.field_1.a;
LAB_003dc606:
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc930:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1448,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    waveSpeedZ = param[0xb].field_0.field_1.a;
LAB_003dc61d:
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc911:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1449,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    falloff = param[0xc].field_0.i;
LAB_003dc632:
    if (param[0xd].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc8f2:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144a,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    highpoint = param[0xd].field_0.i;
LAB_003dc647:
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc8d3:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144b,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    rollIntensity = param[0xe].field_0.f;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc99f;
    }
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003dc5c3;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc9be;
    }
    iVar8 = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003dc5d8;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc96e;
    }
    waveSpeedX = (void *)param[9].field_0.f;
    if ((uint)numparam < 0xb) {
      param = defaultparam->Array;
      goto LAB_003dc5ef;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc94f;
    }
    waveSpeedY = (void *)param[10].field_0.f;
    if (numparam == 0xb) {
      param = defaultparam->Array;
      goto LAB_003dc606;
    }
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc930;
    }
    waveSpeedZ = (void *)param[0xb].field_0.f;
    if ((uint)numparam < 0xd) {
      param = defaultparam->Array;
      goto LAB_003dc61d;
    }
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc911;
    }
    falloff = param[0xc].field_0.i;
    if (numparam == 0xd) {
      param = defaultparam->Array;
      goto LAB_003dc632;
    }
    if (param[0xd].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc8f2;
    }
    highpoint = param[0xd].field_0.i;
    if ((uint)numparam < 0xf) {
      param = defaultparam->Array;
      goto LAB_003dc647;
    }
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc8d3;
    }
    rollIntensity = param[0xe].field_0.f;
    if (numparam != 0xf) {
      if (param[0xf].field_0.field_3.Type != '\x01') {
        pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003dc8b4;
      }
      goto LAB_003dc66c;
    }
    param = defaultparam->Array;
  }
  if (param[0xf].field_0.field_3.Type != '\x01') {
    pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc8b4:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x144c,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003dc66c:
  P_StartQuakeXYZ(activator,0,(pVVar1->field_0).i,(pVVar2->field_0).i,(pVVar3->field_0).i,
                  (pVVar4->field_0).i,(pVVar5->field_0).i,(pVVar6->field_0).i,&local_34,iVar8,
                  (double)waveSpeedX,(double)waveSpeedY,(double)waveSpeedZ,falloff,highpoint,
                  rollIntensity,param[0xf].field_0.f);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QuakeEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(intensityX);
	PARAM_INT(intensityY);
	PARAM_INT(intensityZ);
	PARAM_INT(duration);
	PARAM_INT(damrad);
	PARAM_INT(tremrad);
	PARAM_SOUND_DEF(sound);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(mulWaveX);
	PARAM_FLOAT_DEF(mulWaveY);
	PARAM_FLOAT_DEF(mulWaveZ);
	PARAM_INT_DEF(falloff);
	PARAM_INT_DEF(highpoint);
	PARAM_FLOAT_DEF(rollIntensity);
	PARAM_FLOAT_DEF(rollWave);
	P_StartQuakeXYZ(self, 0, intensityX, intensityY, intensityZ, duration, damrad, tremrad, sound, flags, mulWaveX, mulWaveY, mulWaveZ, falloff, highpoint, 
		rollIntensity, rollWave);
	return 0;
}